

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O0

int s2_semi_mgau_frame_eval
              (s2_semi_mgau_t *s,ascr_t *ascr,fast_gmm_t *fgmm,mfcc_t **featbuf,int32 frame)

{
  int iVar1;
  int iVar2;
  vqFeature_t **local_40;
  vqFeature_t **lastf;
  int local_30;
  int topn_idx;
  int i;
  int32 frame_local;
  mfcc_t **featbuf_local;
  fast_gmm_t *fgmm_local;
  ascr_t *ascr_local;
  s2_semi_mgau_t *s_local;
  
  memset(ascr->senscr,0,(long)s->n_sen << 2);
  iVar2 = frame % s->n_topn_hist;
  s->f = s->topn_hist[iVar2];
  for (local_30 = 0; local_30 < s->n_feat; local_30 = local_30 + 1) {
    if (s->frame_idx <= frame) {
      if (iVar2 == 0) {
        local_40 = s->topn_hist[s->n_topn_hist + -1];
      }
      else {
        local_40 = s->topn_hist[iVar2 + -1];
      }
      memcpy(s->f[local_30],local_40[local_30],(long)s->max_topn << 3);
      mgau_dist(s,frame,local_30,featbuf[local_30]);
      iVar1 = mgau_norm(s,local_30);
      s->topn_hist_n[iVar2][local_30] = (uint8)iVar1;
    }
    get_scores_8b_feat(s,local_30,(uint)s->topn_hist_n[iVar2][local_30],ascr->senscr,
                       ascr->sen_active);
  }
  return 0;
}

Assistant:

int
s2_semi_mgau_frame_eval(s2_semi_mgau_t *s,
                        ascr_t *ascr,
                        fast_gmm_t *fgmm,
                        mfcc_t **featbuf,
                        int32 frame)
{
    int i, topn_idx;

    memset(ascr->senscr, 0, s->n_sen * sizeof(*ascr->senscr));
    /* No bounds checking is done here, which just means you'll get
     * semi-random crap if you request a frame in the future or one
     * that's too far in the past. */
    topn_idx = frame % s->n_topn_hist;
    s->f = s->topn_hist[topn_idx];
    for (i = 0; i < s->n_feat; ++i) {
        /* For past frames this will already be computed. */
        if (frame >= s->frame_idx) {
            vqFeature_t **lastf;
            if (topn_idx == 0)
                lastf = s->topn_hist[s->n_topn_hist-1];
            else
                lastf = s->topn_hist[topn_idx-1];
            memcpy(s->f[i], lastf[i], sizeof(vqFeature_t) * s->max_topn);
            mgau_dist(s, frame, i, featbuf[i]);
            s->topn_hist_n[topn_idx][i] = mgau_norm(s, i);
        }
        get_scores_8b_feat(s, i, s->topn_hist_n[topn_idx][i],
                           ascr->senscr, ascr->sen_active);
    }

    return 0;
}